

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O1

bool __thiscall
cmFindPackageCommand::CheckPackageRegistryEntry
          (cmFindPackageCommand *this,string *fname,cmSearchPath *outPaths)

{
  bool bVar1;
  bool bVar2;
  string local_40;
  
  bVar1 = cmsys::SystemTools::FileIsFullPath((fname->_M_dataplus)._M_p);
  bVar2 = true;
  if (bVar1) {
    bVar1 = cmsys::SystemTools::FileExists((fname->_M_dataplus)._M_p);
    if (bVar1) {
      bVar1 = cmsys::SystemTools::FileIsDirectory(fname);
      if (bVar1) {
        cmSearchPath::AddPath(outPaths,fname);
      }
      else {
        cmsys::SystemTools::GetFilenamePath(&local_40,fname);
        cmSearchPath::AddPath(outPaths,&local_40);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_40._M_dataplus._M_p != &local_40.field_2) {
          operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
        }
      }
    }
    else {
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool cmFindPackageCommand::CheckPackageRegistryEntry(const std::string& fname,
                                                     cmSearchPath& outPaths)
{
  // Parse the content of one package registry entry.
  if (cmSystemTools::FileIsFullPath(fname.c_str())) {
    // The first line in the stream is the full path to a file or
    // directory containing the package.
    if (cmSystemTools::FileExists(fname.c_str())) {
      // The path exists.  Look for the package here.
      if (!cmSystemTools::FileIsDirectory(fname)) {
        outPaths.AddPath(cmSystemTools::GetFilenamePath(fname));
      } else {
        outPaths.AddPath(fname);
      }
      return true;
    }
    // The path does not exist.  Assume the stream content is
    // associated with an old package that no longer exists, and
    // delete it to keep the package registry clean.
    return false;
  }
  // The first line in the stream is not the full path to a file or
  // directory.  Assume the stream content was created by a future
  // version of CMake that uses a different format, and leave it.
  return true;
}